

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O1

bool __thiscall ON_NurbsSurface::IsNatural(ON_NurbsSurface *this,int dir,int end)

{
  double *pdVar1;
  size_t parameter_count;
  bool bVar2;
  double dVar3;
  double parameter_list [2];
  ON_Interval domain;
  double local_48;
  double local_40;
  ON_Interval local_38;
  
  if ((uint)end < 3 && (uint)dir < 2) {
    pdVar1 = &local_48;
    (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])();
    local_48 = ON_DBL_QNAN;
    local_40 = ON_DBL_QNAN;
    bVar2 = (end & 1U) == 0;
    if (bVar2) {
      pdVar1 = &local_40;
      local_48 = ON_Interval::operator[](&local_38,0);
    }
    parameter_count = (size_t)bVar2;
    if (end - 1U < 2) {
      dVar3 = ON_Interval::operator[](&local_38,1);
      parameter_count = parameter_count + 1;
      *pdVar1 = dVar3;
    }
    bVar2 = IsNatural(this,dir,parameter_count,&local_48);
    return bVar2;
  }
  return false;
}

Assistant:

bool ON_NurbsSurface::IsNatural(int dir, int end) const
{
  if (dir < 0 || dir > 1 || end < 0 || end > 2)
    return false;

  const ON_Interval domain = Domain(dir);
  size_t parameter_count = 0;
  double parameter_list[2] = {ON_DBL_QNAN,ON_DBL_QNAN};
  if (0 == end || 2 == end)
    parameter_list[parameter_count++] = domain[0];
  if (1 == end || 2 == end)
    parameter_list[parameter_count++] = domain[1];
  return ON_NurbsSurface::IsNatural(dir, parameter_count, parameter_list);
}